

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O3

xmlDeregisterNodeFunc xmlThrDefDeregisterNodeDefault(xmlDeregisterNodeFunc func)

{
  xmlDeregisterNodeFunc p_Var1;
  
  xmlMutexLock(&xmlThrDefMutex);
  p_Var1 = xmlDeregisterNodeDefaultValueThrDef;
  xmlRegisterCallbacks = 1;
  xmlDeregisterNodeDefaultValueThrDef = func;
  xmlMutexUnlock(&xmlThrDefMutex);
  return p_Var1;
}

Assistant:

xmlDeregisterNodeFunc
xmlThrDefDeregisterNodeDefault(xmlDeregisterNodeFunc func)
{
    xmlDeregisterNodeFunc old;

    xmlMutexLock(&xmlThrDefMutex);
    old = xmlDeregisterNodeDefaultValueThrDef;

    xmlRegisterCallbacks = 1;
    xmlDeregisterNodeDefaultValueThrDef = func;
    xmlMutexUnlock(&xmlThrDefMutex);

    return(old);
}